

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNOT.cpp
# Opt level: O0

void test_qclab_qgates_CNOT<double>(void)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  gate_type *pgVar4;
  char *in_R9;
  AssertHelper local_2080;
  Message local_2078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2070;
  undefined1 local_2050 [8];
  AssertionResult gtest_ar_56;
  Message local_2038;
  int local_2030;
  int local_202c;
  undefined1 local_2028 [8];
  AssertionResult gtest_ar_55;
  stringstream qasm_6;
  ostream local_2008 [376];
  string local_1e90;
  AssertHelper local_1e70;
  Message local_1e68;
  QControlledGate2<double> local_1e60;
  bool local_1e49;
  undefined1 local_1e48 [8];
  AssertionResult gtest_ar__34;
  SquareMatrix<double> CNOT_check_6;
  Message local_1e20;
  int local_1e18;
  int local_1e14;
  undefined1 local_1e10 [8];
  AssertionResult gtest_ar_54;
  Message local_1df8;
  int local_1df0;
  int local_1dec;
  undefined1 local_1de8 [8];
  AssertionResult gtest_ar_53;
  Message local_1dd0;
  int local_1dc8;
  int local_1dc4;
  undefined1 local_1dc0 [8];
  AssertionResult gtest_ar_52;
  AssertHelper local_1d90;
  Message local_1d88;
  bool local_1d79;
  undefined1 local_1d78 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_1d48;
  Message local_1d40;
  bool local_1d31;
  undefined1 local_1d30 [8];
  AssertionResult gtest_ar__32;
  Message local_1d18;
  int local_1d10;
  int local_1d0c;
  undefined1 local_1d08 [8];
  AssertionResult gtest_ar_51;
  CNOT<double> cnot10_1;
  Message local_1cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cd0;
  undefined1 local_1cb0 [8];
  AssertionResult gtest_ar_50;
  Message local_1c98;
  int local_1c90;
  int local_1c8c;
  undefined1 local_1c88 [8];
  AssertionResult gtest_ar_49;
  stringstream qasm_5;
  ostream local_1c68 [376];
  string local_1af0;
  AssertHelper local_1ad0;
  Message local_1ac8;
  QControlledGate2<double> local_1ac0;
  bool local_1aa9;
  undefined1 local_1aa8 [8];
  AssertionResult gtest_ar__31;
  SquareMatrix<double> CNOT_check_5;
  Message local_1a80;
  int local_1a78;
  int local_1a74;
  undefined1 local_1a70 [8];
  AssertionResult gtest_ar_48;
  Message local_1a58;
  int local_1a50;
  int local_1a4c;
  undefined1 local_1a48 [8];
  AssertionResult gtest_ar_47;
  Message local_1a30;
  int local_1a28;
  int local_1a24;
  undefined1 local_1a20 [8];
  AssertionResult gtest_ar_46;
  AssertHelper local_19f0;
  Message local_19e8;
  bool local_19d9;
  undefined1 local_19d8 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_19a8;
  Message local_19a0;
  bool local_1991;
  undefined1 local_1990 [8];
  AssertionResult gtest_ar__29;
  Message local_1978;
  int local_1970;
  int local_196c;
  undefined1 local_1968 [8];
  AssertionResult gtest_ar_45;
  CNOT<double> cnot01_1;
  Message local_1938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1930;
  undefined1 local_1910 [8];
  AssertionResult gtest_ar_44;
  Message local_18f8;
  int local_18f0;
  int local_18ec;
  undefined1 local_18e8 [8];
  AssertionResult gtest_ar_43;
  stringstream qasm_4;
  ostream local_18c8 [376];
  string local_1750;
  AssertHelper local_1730;
  Message local_1728;
  QControlledGate2<double> local_1720;
  bool local_1709;
  undefined1 local_1708 [8];
  AssertionResult gtest_ar__28;
  SquareMatrix<double> CNOT_check_4;
  Message local_16e0;
  int local_16d8;
  int local_16d4;
  undefined1 local_16d0 [8];
  AssertionResult gtest_ar_42;
  Message local_16b8;
  int local_16b0;
  int local_16ac;
  undefined1 local_16a8 [8];
  AssertionResult gtest_ar_41;
  Message local_1690;
  int local_1688;
  int local_1684;
  undefined1 local_1680 [8];
  AssertionResult gtest_ar_40;
  AssertHelper local_1650;
  Message local_1648;
  bool local_1639;
  undefined1 local_1638 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_1608;
  Message local_1600;
  bool local_15f1;
  undefined1 local_15f0 [8];
  AssertionResult gtest_ar__26;
  Message local_15d8;
  int local_15d0;
  int local_15cc;
  undefined1 local_15c8 [8];
  AssertionResult gtest_ar_39;
  CNOT<double> cnot53;
  Message local_1598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1590;
  undefined1 local_1570 [8];
  AssertionResult gtest_ar_38;
  Message local_1558;
  int local_1550;
  int local_154c;
  undefined1 local_1548 [8];
  AssertionResult gtest_ar_37;
  stringstream qasm_3;
  ostream local_1528 [376];
  string local_13b0;
  AssertHelper local_1390;
  Message local_1388;
  QControlledGate2<double> local_1380;
  bool local_1369;
  undefined1 local_1368 [8];
  AssertionResult gtest_ar__25;
  SquareMatrix<double> CNOT_check_3;
  Message local_1340;
  int local_1338;
  int local_1334;
  undefined1 local_1330 [8];
  AssertionResult gtest_ar_36;
  Message local_1318;
  int local_1310;
  int local_130c;
  undefined1 local_1308 [8];
  AssertionResult gtest_ar_35;
  Message local_12f0;
  int local_12e8;
  int local_12e4;
  undefined1 local_12e0 [8];
  AssertionResult gtest_ar_34;
  AssertHelper local_12b0;
  Message local_12a8;
  bool local_1299;
  undefined1 local_1298 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_1268;
  Message local_1260;
  bool local_1251;
  undefined1 local_1250 [8];
  AssertionResult gtest_ar__23;
  Message local_1238;
  int local_1230;
  int local_122c;
  undefined1 local_1228 [8];
  AssertionResult gtest_ar_33;
  CNOT<double> cnot10;
  Message local_11f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f0;
  undefined1 local_11d0 [8];
  AssertionResult gtest_ar_32;
  Message local_11b8;
  int local_11b0;
  int local_11ac;
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar_31;
  stringstream qasm_2;
  ostream local_1188 [376];
  string local_1010;
  AssertHelper local_ff0;
  Message local_fe8;
  QControlledGate2<double> local_fe0;
  bool local_fc9;
  undefined1 local_fc8 [8];
  AssertionResult gtest_ar__22;
  SquareMatrix<double> CNOT_check_2;
  Message local_fa0;
  int local_f98;
  int local_f94;
  undefined1 local_f90 [8];
  AssertionResult gtest_ar_30;
  Message local_f78;
  int local_f70;
  int local_f6c;
  undefined1 local_f68 [8];
  AssertionResult gtest_ar_29;
  Message local_f50;
  int local_f48;
  int local_f44;
  undefined1 local_f40 [8];
  AssertionResult gtest_ar_28;
  AssertHelper local_f10;
  Message local_f08;
  bool local_ef9;
  undefined1 local_ef8 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_ec8;
  Message local_ec0;
  bool local_eb1;
  undefined1 local_eb0 [8];
  AssertionResult gtest_ar__20;
  Message local_e98;
  int local_e90;
  int local_e8c;
  undefined1 local_e88 [8];
  AssertionResult gtest_ar_27;
  CNOT<double> cnot35;
  Message local_e58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  undefined1 local_e30 [8];
  AssertionResult gtest_ar_26;
  Message local_e18;
  int local_e10;
  int local_e0c;
  undefined1 local_e08 [8];
  AssertionResult gtest_ar_25;
  stringstream qasm_1;
  ostream local_de8 [376];
  string local_c70;
  AssertHelper local_c50;
  Message local_c48;
  QControlledGate2<double> local_c40;
  bool local_c29;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<double> CNOT_check_1;
  Message local_c00;
  int local_bf8;
  int local_bf4;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar_24;
  Message local_bd8;
  int local_bd0;
  int local_bcc;
  undefined1 local_bc8 [8];
  AssertionResult gtest_ar_23;
  Message local_bb0;
  int local_ba8;
  int local_ba4;
  undefined1 local_ba0 [8];
  AssertionResult gtest_ar_22;
  AssertHelper local_b70;
  Message local_b68;
  bool local_b59;
  undefined1 local_b58 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_b28;
  Message local_b20;
  bool local_b11;
  undefined1 local_b10 [8];
  AssertionResult gtest_ar__17;
  Message local_af8;
  int local_af0;
  int local_aec;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_21;
  CNOT<double> cnot01;
  AssertHelper local_aa0;
  Message local_a98;
  bool local_a89;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_a58;
  Message local_a50;
  bool local_a41;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar__15;
  Message local_a28;
  int local_a20;
  int local_a1c;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar_20;
  Message local_a00;
  int local_9f8;
  int local_9f4;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar_19;
  Message local_9d8;
  int local_9d0;
  int local_9cc;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_998;
  Message local_990;
  bool local_981;
  undefined1 local_980 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_950;
  Message local_948;
  bool local_939;
  undefined1 local_938 [8];
  AssertionResult gtest_ar__13;
  Message local_920;
  int local_918;
  int local_914;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_17;
  Message local_8f8;
  int local_8f0;
  int local_8ec;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_8b8;
  Message local_8b0;
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_870;
  Message local_868;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__11;
  Message local_840;
  int local_838;
  int local_834;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_15;
  Message local_818;
  int local_810;
  int local_80c;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_14;
  AssertHelper local_7d8;
  Message local_7d0;
  bool local_7c1;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_790;
  Message local_788;
  bool local_779;
  undefined1 local_778 [8];
  AssertionResult gtest_ar__9;
  Message local_760;
  int local_758;
  int local_754;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_13;
  Message local_738;
  int local_730;
  int local_72c;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_6f8;
  Message local_6f0;
  bool local_6e1;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_6b0;
  Message local_6a8;
  bool local_699;
  undefined1 local_698 [8];
  AssertionResult gtest_ar__7;
  CNOT<double> cnot2;
  AssertHelper local_650;
  Message local_648;
  bool local_639;
  undefined1 local_638 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_608;
  Message local_600;
  bool local_5f1;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_5c0;
  Message local_5b8;
  SquareMatrix<double> local_5b0;
  SquareMatrix<double> local_5a0;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_558;
  Message local_550;
  bool local_541;
  undefined1 local_540 [8];
  AssertionResult gtest_ar__3;
  PauliX<double> X;
  AssertHelper local_500;
  Message local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_11;
  Message local_4b8;
  int local_4b0;
  int local_4ac;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_10;
  stringstream qasm;
  ostream local_488 [376];
  AssertHelper local_310;
  Message local_308;
  int local_2fc;
  vector<int,_std::allocator<int>_> local_2f8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_9;
  Message local_2c8;
  int local_2bc;
  vector<int,_std::allocator<int>_> local_2b8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_8;
  int qnew [2];
  Message local_280;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_7;
  Message local_258;
  int local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_6;
  Message local_230;
  int local_224;
  size_type local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_5;
  vector<int,_std::allocator<int>_> qubits;
  Message local_1e8;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_1a8;
  Message local_1a0;
  QControlledGate2<double> local_198;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  SquareMatrix<double> CNOT_check;
  Message local_158;
  int local_150;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  int local_128;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  int local_100;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  Message local_50;
  int local_48 [5];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  CNOT<double> cnot;
  
  qclab::qgates::CX<double>::CX((CX<double> *)&gtest_ar.message_);
  local_34 = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar.message_);
  local_48[0] = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"cnot.nbQubits()","2",&local_34,local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_69 = qclab::qgates::CX<double>::fixed((CX<double> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_68,
               (AssertionResult *)"cnot.fixed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_b1 = qclab::qgates::QControlledGate2<double>::controlled
                       ((QControlledGate2<double> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_b0,
               (AssertionResult *)"cnot.controlled()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_fc = qclab::qgates::QControlledGate2<double>::control
                       ((QControlledGate2<double> *)&gtest_ar.message_);
  local_100 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f8,"cnot.control()","0",&local_fc,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_124 = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar.message_);
  local_128 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_120,"cnot.target()","1",&local_124,&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_14c = qclab::qgates::QControlledGate2<double>::controlState
                        ((QControlledGate2<double> *)&gtest_ar.message_);
  local_150 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_148,"cnot.controlState()","1",&local_14c,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check.data_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check.data_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__2.message_,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,
             0.0,1.0,0.0,0.0,1.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix(&local_198);
  local_181 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&local_198,
                         (SquareMatrix<double> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_180,
               (AssertionResult *)"cnot.matrix() == CNOT_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1dc = qclab::qgates::CX<double>::qubit((CX<double> *)&gtest_ar.message_);
  local_1e0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1d8,"cnot.qubit()","0",&local_1dc,&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  qclab::qgates::QControlledGate2<double>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_5.message_,
             (QControlledGate2<double> *)&gtest_ar.message_);
  local_220 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_5.message_);
  local_224 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_218,"qubits.size()","2",&local_220,&local_224);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_5.message_,0);
  local_24c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_248,"qubits[0]","0",pvVar3,&local_24c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_5.message_,1);
  local_274 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_270,"qubits[1]","1",pvVar3,&local_274);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x300000005;
  qclab::qgates::QControlledGate2<double>::setQubits
            ((QControlledGate2<double> *)&gtest_ar.message_,(int *)&gtest_ar_8.message_);
  qclab::qgates::QControlledGate2<double>::qubits
            (&local_2b8,(QControlledGate2<double> *)&gtest_ar.message_);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_2b8,0);
  local_2bc = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a0,"cnot.qubits()[0]","3",pvVar3,&local_2bc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  qclab::qgates::QControlledGate2<double>::qubits
            (&local_2f8,(QControlledGate2<double> *)&gtest_ar.message_);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_2f8,1);
  local_2fc = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2e0,"cnot.qubits()[1]","5",pvVar3,&local_2fc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  qclab::qgates::QControlledGate2<double>::setQubits
            ((QControlledGate2<double> *)&gtest_ar.message_,(int *)&gtest_ar_8.message_);
  qclab::qgates::QGate2<double>::print((QGate2<double> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_10.message_);
  local_4ac = qclab::qgates::CX<double>::toQASM((CX<double> *)&gtest_ar.message_,local_488,0);
  local_4b0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_4a8,"cnot.toQASM( qasm )","0",&local_4ac,&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[16],_nullptr>
            ((EqHelper *)local_4d0,"qasm.str()","\"cx q[0], q[1];\\n\"",&local_4f0,
             (char (*) [16])"cx q[0], q[1];\n");
  std::__cxx11::string::~string((string *)&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&X.super_QGate1<double>.qubit_);
  std::__cxx11::string::~string((string *)&X.super_QGate1<double>.qubit_);
  qclab::qgates::PauliX<double>::PauliX((PauliX<double> *)&gtest_ar__3.message_);
  pgVar4 = qclab::qgates::CX<double>::gate((CX<double> *)&gtest_ar.message_);
  local_541 = qclab::QObject<double>::operator==
                        ((QObject<double> *)pgVar4,(QObject<double> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_540,&local_541,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_540,
               (AssertionResult *)"*cnot.gate() == X","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  pgVar4 = qclab::qgates::CX<double>::gate((CX<double> *)&gtest_ar.message_);
  (*(pgVar4->super_QGate1<double>).super_QObject<double>._vptr_QObject[7])(&local_5a0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_5b0);
  local_589 = qclab::dense::SquareMatrix<double>::operator==(&local_5a0,&local_5b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_588,&local_589,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_5b0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_588,
               (AssertionResult *)"cnot.gate()->matrix() == X.matrix()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  local_5f1 = qclab::QObject<double>::operator!=
                        ((QObject<double> *)&gtest_ar.message_,
                         (QObject<double> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f0,&local_5f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_5f0,(AssertionResult *)"cnot != X",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  bVar1 = qclab::QObject<double>::operator==
                    ((QObject<double> *)&gtest_ar.message_,(QObject<double> *)&gtest_ar__3.message_)
  ;
  local_639 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_638,&local_639,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_648);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&cnot2.gate_,(internal *)local_638,(AssertionResult *)"cnot == X","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_650,&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_650);
    std::__cxx11::string::~string((string *)&cnot2.gate_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  qclab::qgates::CX<double>::CX((CX<double> *)&gtest_ar__7.message_);
  local_699 = qclab::QObject<double>::operator==
                        ((QObject<double> *)&gtest_ar.message_,
                         (QObject<double> *)&gtest_ar__7.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_698,&local_699,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_698,
               (AssertionResult *)"cnot == cnot2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6b0,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  bVar1 = qclab::QObject<double>::operator!=
                    ((QObject<double> *)&gtest_ar.message_,(QObject<double> *)&gtest_ar__7.message_)
  ;
  local_6e1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6e0,&local_6e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_6f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_6e0,
               (AssertionResult *)"cnot != cnot2","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper(&local_6f8);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  qclab::qgates::QControlledGate2<double>::setControl
            ((QControlledGate2<double> *)&gtest_ar.message_,3);
  local_72c = qclab::qgates::QControlledGate2<double>::control
                        ((QControlledGate2<double> *)&gtest_ar.message_);
  local_730 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_728,"cnot.control()","3",&local_72c,&local_730);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  qclab::qgates::CX<double>::setTarget((CX<double> *)&gtest_ar.message_,5);
  local_754 = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar.message_);
  local_758 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_750,"cnot.target()","5",&local_754,&local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  local_779 = qclab::QObject<double>::operator==
                        ((QObject<double> *)&gtest_ar.message_,
                         (QObject<double> *)&gtest_ar__7.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_778,&local_779,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_778,
               (AssertionResult *)"cnot == cnot2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  bVar1 = qclab::QObject<double>::operator!=
                    ((QObject<double> *)&gtest_ar.message_,(QObject<double> *)&gtest_ar__7.message_)
  ;
  local_7c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c0,&local_7c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_14.message_,(internal *)local_7c0,
               (AssertionResult *)"cnot != cnot2","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  qclab::qgates::QControlledGate2<double>::setControl
            ((QControlledGate2<double> *)&gtest_ar.message_,4);
  local_80c = qclab::qgates::QControlledGate2<double>::control
                        ((QControlledGate2<double> *)&gtest_ar.message_);
  local_810 = 4;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_808,"cnot.control()","4",&local_80c,&local_810);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_818);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  qclab::qgates::CX<double>::setTarget((CX<double> *)&gtest_ar.message_,1);
  local_834 = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar.message_);
  local_838 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_830,"cnot.target()","1",&local_834,&local_838);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar1) {
    testing::Message::Message(&local_840);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11.message_,&local_840);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  local_859 = qclab::QObject<double>::operator!=
                        ((QObject<double> *)&gtest_ar.message_,
                         (QObject<double> *)&gtest_ar__7.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_858,&local_859,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_858,
               (AssertionResult *)"cnot != cnot2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_870,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_870,&local_868);
    testing::internal::AssertHelper::~AssertHelper(&local_870);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  bVar1 = qclab::QObject<double>::operator==
                    ((QObject<double> *)&gtest_ar.message_,(QObject<double> *)&gtest_ar__7.message_)
  ;
  local_8a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a0,&local_8a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_16.message_,(internal *)local_8a0,
               (AssertionResult *)"cnot == cnot2","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  this = &gtest_ar_5.message_;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)this,0);
  *pvVar3 = 1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)this,1);
  *pvVar3 = 2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)this,0);
  qclab::qgates::QControlledGate2<double>::setQubits
            ((QControlledGate2<double> *)&gtest_ar.message_,pvVar3);
  local_8ec = qclab::qgates::QControlledGate2<double>::control
                        ((QControlledGate2<double> *)&gtest_ar.message_);
  local_8f0 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_8e8,"cnot.control()","1",&local_8ec,&local_8f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  local_914 = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar.message_);
  local_918 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_910,"cnot.target()","2",&local_914,&local_918);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar1) {
    testing::Message::Message(&local_920);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__13.message_,&local_920);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  local_939 = qclab::QObject<double>::operator==
                        ((QObject<double> *)&gtest_ar.message_,
                         (QObject<double> *)&gtest_ar__7.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_938,&local_939,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
  if (!bVar1) {
    testing::Message::Message(&local_948);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_938,
               (AssertionResult *)"cnot == cnot2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_950,&local_948);
    testing::internal::AssertHelper::~AssertHelper(&local_950);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
  bVar1 = qclab::QObject<double>::operator!=
                    ((QObject<double> *)&gtest_ar.message_,(QObject<double> *)&gtest_ar__7.message_)
  ;
  local_981 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_980,&local_981,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(&local_990);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_18.message_,(internal *)local_980,
               (AssertionResult *)"cnot != cnot2","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_998,&local_990);
    testing::internal::AssertHelper::~AssertHelper(&local_998);
    std::__cxx11::string::~string((string *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  qclab::qgates::QControlledGate2<double>::setControl
            ((QControlledGate2<double> *)&gtest_ar.message_,0);
  local_9cc = qclab::qgates::QControlledGate2<double>::control
                        ((QControlledGate2<double> *)&gtest_ar.message_);
  local_9d0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9c8,"cnot.control()","0",&local_9cc,&local_9d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar1) {
    testing::Message::Message(&local_9d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  qclab::qgates::CX<double>::setTarget((CX<double> *)&gtest_ar.message_,1);
  local_9f4 = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar.message_);
  local_9f8 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9f0,"cnot.target()","1",&local_9f4,&local_9f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
  if (!bVar1) {
    testing::Message::Message(&local_a00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_a00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
  qclab::qgates::QControlledGate2<double>::setControlState
            ((QControlledGate2<double> *)&gtest_ar.message_,0);
  local_a1c = qclab::qgates::QControlledGate2<double>::controlState
                        ((QControlledGate2<double> *)&gtest_ar.message_);
  local_a20 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a18,"cnot.controlState()","0",&local_a1c,&local_a20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
  if (!bVar1) {
    testing::Message::Message(&local_a28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__15.message_,&local_a28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
  local_a41 = qclab::QObject<double>::operator!=
                        ((QObject<double> *)&gtest_ar.message_,
                         (QObject<double> *)&gtest_ar__7.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a40,&local_a41,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar1) {
    testing::Message::Message(&local_a50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_a40,
               (AssertionResult *)"cnot != cnot2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a58,&local_a50);
    testing::internal::AssertHelper::~AssertHelper(&local_a58);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  bVar1 = qclab::QObject<double>::operator==
                    ((QObject<double> *)&gtest_ar.message_,(QObject<double> *)&gtest_ar__7.message_)
  ;
  local_a89 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a88,&local_a89,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    testing::Message::Message(&local_a98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&cnot01.gate_,(internal *)local_a88,(AssertionResult *)"cnot == cnot2",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_aa0,&local_a98);
    testing::internal::AssertHelper::~AssertHelper(&local_aa0);
    std::__cxx11::string::~string((string *)&cnot01.gate_);
    testing::Message::~Message(&local_a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  qclab::qgates::CX<double>::~CX((CX<double> *)&gtest_ar__7.message_);
  qclab::qgates::PauliX<double>::~PauliX((PauliX<double> *)&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_10.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_5.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__2.message_);
  qclab::qgates::CX<double>::~CX((CX<double> *)&gtest_ar.message_);
  qclab::qgates::CX<double>::CX((CX<double> *)&gtest_ar_21.message_,0,1,1);
  local_aec = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar_21.message_);
  local_af0 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_ae8,"cnot01.nbQubits()","2",&local_aec,&local_af0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_af8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_af8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  local_b11 = qclab::qgates::CX<double>::fixed((CX<double> *)&gtest_ar_21.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b10,&local_b11,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b10);
  if (!bVar1) {
    testing::Message::Message(&local_b20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_b10,
               (AssertionResult *)"cnot01.fixed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b28,&local_b20);
    testing::internal::AssertHelper::~AssertHelper(&local_b28);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_b20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b10);
  local_b59 = qclab::qgates::QControlledGate2<double>::controlled
                        ((QControlledGate2<double> *)&gtest_ar_21.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b58,&local_b59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
  if (!bVar1) {
    testing::Message::Message(&local_b68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_22.message_,(internal *)local_b58,
               (AssertionResult *)"cnot01.controlled()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b70,&local_b68);
    testing::internal::AssertHelper::~AssertHelper(&local_b70);
    std::__cxx11::string::~string((string *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
  local_ba4 = qclab::qgates::QControlledGate2<double>::control
                        ((QControlledGate2<double> *)&gtest_ar_21.message_);
  local_ba8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_ba0,"cnot01.control()","0",&local_ba4,&local_ba8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba0);
  if (!bVar1) {
    testing::Message::Message(&local_bb0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ba0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba0);
  local_bcc = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar_21.message_);
  local_bd0 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_bc8,"cnot01.target()","1",&local_bcc,&local_bd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc8);
  if (!bVar1) {
    testing::Message::Message(&local_bd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_bd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
  local_bf4 = qclab::qgates::QControlledGate2<double>::controlState
                        ((QControlledGate2<double> *)&gtest_ar_21.message_);
  local_bf8 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_bf0,"cnot01.controlState()","1",&local_bf4,&local_bf8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf0);
  if (!bVar1) {
    testing::Message::Message(&local_c00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bf0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check_1.data_,&local_c00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check_1.data_);
    testing::Message::~Message(&local_c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__19.message_,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,
             0.0,1.0,0.0,0.0,1.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix(&local_c40);
  local_c29 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&local_c40,
                         (SquareMatrix<double> *)&gtest_ar__19.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c28,&local_c29,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&local_c40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c28);
  if (!bVar1) {
    testing::Message::Message(&local_c48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c70,(internal *)local_c28,(AssertionResult *)"cnot01.matrix() == CNOT_check",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c50,&local_c48);
    testing::internal::AssertHelper::~AssertHelper(&local_c50);
    std::__cxx11::string::~string((string *)&local_c70);
    testing::Message::~Message(&local_c48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_25.message_);
  local_e0c = qclab::qgates::CX<double>::toQASM((CX<double> *)&gtest_ar_21.message_,local_de8,0);
  local_e10 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e08,"cnot01.toQASM( qasm )","0",&local_e0c,&local_e10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e08);
  if (!bVar1) {
    testing::Message::Message(&local_e18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_e18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_e18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e08);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[16],_nullptr>
            ((EqHelper *)local_e30,"qasm.str()","\"cx q[0], q[1];\\n\"",&local_e50,
             (char (*) [16])"cx q[0], q[1];\n");
  std::__cxx11::string::~string((string *)&local_e50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e30);
  if (!bVar1) {
    testing::Message::Message(&local_e58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot35.gate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot35.gate_,&local_e58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot35.gate_);
    testing::Message::~Message(&local_e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e30);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_25.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__19.message_);
  qclab::qgates::CX<double>::~CX((CX<double> *)&gtest_ar_21.message_);
  qclab::qgates::CX<double>::CX((CX<double> *)&gtest_ar_27.message_,3,5,1);
  local_e8c = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar_27.message_);
  local_e90 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e88,"cnot35.nbQubits()","2",&local_e8c,&local_e90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e88);
  if (!bVar1) {
    testing::Message::Message(&local_e98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__20.message_,&local_e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_e98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e88);
  local_eb1 = qclab::qgates::CX<double>::fixed((CX<double> *)&gtest_ar_27.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_eb0,&local_eb1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_eb0);
  if (!bVar1) {
    testing::Message::Message(&local_ec0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_eb0,
               (AssertionResult *)"cnot35.fixed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ec8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ec8,&local_ec0);
    testing::internal::AssertHelper::~AssertHelper(&local_ec8);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_ec0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_eb0);
  local_ef9 = qclab::qgates::QControlledGate2<double>::controlled
                        ((QControlledGate2<double> *)&gtest_ar_27.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ef8,&local_ef9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef8);
  if (!bVar1) {
    testing::Message::Message(&local_f08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_28.message_,(internal *)local_ef8,
               (AssertionResult *)"cnot35.controlled()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f10,&local_f08);
    testing::internal::AssertHelper::~AssertHelper(&local_f10);
    std::__cxx11::string::~string((string *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_f08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef8);
  local_f44 = qclab::qgates::QControlledGate2<double>::control
                        ((QControlledGate2<double> *)&gtest_ar_27.message_);
  local_f48 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f40,"cnot35.control()","3",&local_f44,&local_f48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f40);
  if (!bVar1) {
    testing::Message::Message(&local_f50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_f50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_f50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f40);
  local_f6c = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar_27.message_);
  local_f70 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f68,"cnot35.target()","5",&local_f6c,&local_f70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f68);
  if (!bVar1) {
    testing::Message::Message(&local_f78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_f78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_f78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f68);
  local_f94 = qclab::qgates::QControlledGate2<double>::controlState
                        ((QControlledGate2<double> *)&gtest_ar_27.message_);
  local_f98 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f90,"cnot35.controlState()","1",&local_f94,&local_f98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f90);
  if (!bVar1) {
    testing::Message::Message(&local_fa0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check_2.data_,&local_fa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check_2.data_);
    testing::Message::~Message(&local_fa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f90);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__22.message_,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,
             0.0,1.0,0.0,0.0,1.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix(&local_fe0);
  local_fc9 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&local_fe0,
                         (SquareMatrix<double> *)&gtest_ar__22.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fc8,&local_fc9,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&local_fe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fc8);
  if (!bVar1) {
    testing::Message::Message(&local_fe8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1010,(internal *)local_fc8,(AssertionResult *)"cnot35.matrix() == CNOT_check",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ff0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ff0,&local_fe8);
    testing::internal::AssertHelper::~AssertHelper(&local_ff0);
    std::__cxx11::string::~string((string *)&local_1010);
    testing::Message::~Message(&local_fe8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fc8);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_31.message_);
  local_11ac = qclab::qgates::CX<double>::toQASM((CX<double> *)&gtest_ar_27.message_,local_1188,0);
  local_11b0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_11a8,"cnot35.toQASM( qasm )","0",&local_11ac,&local_11b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
  if (!bVar1) {
    testing::Message::Message(&local_11b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_11b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_11b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[16],_nullptr>
            ((EqHelper *)local_11d0,"qasm.str()","\"cx q[3], q[5];\\n\"",&local_11f0,
             (char (*) [16])"cx q[3], q[5];\n");
  std::__cxx11::string::~string((string *)&local_11f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11d0);
  if (!bVar1) {
    testing::Message::Message(&local_11f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot10.gate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot10.gate_,&local_11f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot10.gate_);
    testing::Message::~Message(&local_11f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_31.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__22.message_);
  qclab::qgates::CX<double>::~CX((CX<double> *)&gtest_ar_27.message_);
  qclab::qgates::CX<double>::CX((CX<double> *)&gtest_ar_33.message_,1,0,1);
  local_122c = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar_33.message_);
  local_1230 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1228,"cnot10.nbQubits()","2",&local_122c,&local_1230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1228);
  if (!bVar1) {
    testing::Message::Message(&local_1238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__23.message_,&local_1238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_1238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1228);
  local_1251 = qclab::qgates::CX<double>::fixed((CX<double> *)&gtest_ar_33.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1250,&local_1251,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1250);
  if (!bVar1) {
    testing::Message::Message(&local_1260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_1250,
               (AssertionResult *)"cnot10.fixed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1268,&local_1260);
    testing::internal::AssertHelper::~AssertHelper(&local_1268);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_1260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1250);
  local_1299 = qclab::qgates::QControlledGate2<double>::controlled
                         ((QControlledGate2<double> *)&gtest_ar_33.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1298,&local_1299,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1298);
  if (!bVar1) {
    testing::Message::Message(&local_12a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_34.message_,(internal *)local_1298,
               (AssertionResult *)"cnot10.controlled()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=(&local_12b0,&local_12a8);
    testing::internal::AssertHelper::~AssertHelper(&local_12b0);
    std::__cxx11::string::~string((string *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_12a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1298);
  local_12e4 = qclab::qgates::QControlledGate2<double>::control
                         ((QControlledGate2<double> *)&gtest_ar_33.message_);
  local_12e8 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_12e0,"cnot10.control()","1",&local_12e4,&local_12e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12e0);
  if (!bVar1) {
    testing::Message::Message(&local_12f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_12f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_12f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12e0);
  local_130c = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar_33.message_);
  local_1310 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1308,"cnot10.target()","0",&local_130c,&local_1310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1308);
  if (!bVar1) {
    testing::Message::Message(&local_1318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_1318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_1318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1308);
  local_1334 = qclab::qgates::QControlledGate2<double>::controlState
                         ((QControlledGate2<double> *)&gtest_ar_33.message_);
  local_1338 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1330,"cnot10.controlState()","1",&local_1334,&local_1338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1330);
  if (!bVar1) {
    testing::Message::Message(&local_1340);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check_3.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check_3.data_,&local_1340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check_3.data_);
    testing::Message::~Message(&local_1340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1330);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__25.message_,1.0,0.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,
             1.0,0.0,0.0,1.0,0.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix(&local_1380);
  local_1369 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&local_1380,
                          (SquareMatrix<double> *)&gtest_ar__25.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1368,&local_1369,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&local_1380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1368);
  if (!bVar1) {
    testing::Message::Message(&local_1388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_13b0,(internal *)local_1368,(AssertionResult *)"cnot10.matrix() == CNOT_check"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1390,&local_1388);
    testing::internal::AssertHelper::~AssertHelper(&local_1390);
    std::__cxx11::string::~string((string *)&local_13b0);
    testing::Message::~Message(&local_1388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1368);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_37.message_);
  local_154c = qclab::qgates::CX<double>::toQASM((CX<double> *)&gtest_ar_33.message_,local_1528,0);
  local_1550 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1548,"cnot10.toQASM( qasm )","0",&local_154c,&local_1550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1548);
  if (!bVar1) {
    testing::Message::Message(&local_1558);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_1558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_1558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1548);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[16],_nullptr>
            ((EqHelper *)local_1570,"qasm.str()","\"cx q[1], q[0];\\n\"",&local_1590,
             (char (*) [16])"cx q[1], q[0];\n");
  std::__cxx11::string::~string((string *)&local_1590);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1570);
  if (!bVar1) {
    testing::Message::Message(&local_1598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot53.gate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot53.gate_,&local_1598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot53.gate_);
    testing::Message::~Message(&local_1598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1570);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_37.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__25.message_);
  qclab::qgates::CX<double>::~CX((CX<double> *)&gtest_ar_33.message_);
  qclab::qgates::CX<double>::CX((CX<double> *)&gtest_ar_39.message_,5,3,1);
  local_15cc = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar_39.message_);
  local_15d0 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_15c8,"cnot53.nbQubits()","2",&local_15cc,&local_15d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c8);
  if (!bVar1) {
    testing::Message::Message(&local_15d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__26.message_,&local_15d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_15d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c8);
  local_15f1 = qclab::qgates::CX<double>::fixed((CX<double> *)&gtest_ar_39.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_15f0,&local_15f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15f0);
  if (!bVar1) {
    testing::Message::Message(&local_1600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_15f0,
               (AssertionResult *)"cnot53.fixed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1608,&local_1600);
    testing::internal::AssertHelper::~AssertHelper(&local_1608);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_1600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15f0);
  local_1639 = qclab::qgates::QControlledGate2<double>::controlled
                         ((QControlledGate2<double> *)&gtest_ar_39.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1638,&local_1639,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1638);
  if (!bVar1) {
    testing::Message::Message(&local_1648);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_40.message_,(internal *)local_1638,
               (AssertionResult *)"cnot53.controlled()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1650,&local_1648);
    testing::internal::AssertHelper::~AssertHelper(&local_1650);
    std::__cxx11::string::~string((string *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_1648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1638);
  local_1684 = qclab::qgates::QControlledGate2<double>::control
                         ((QControlledGate2<double> *)&gtest_ar_39.message_);
  local_1688 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1680,"cnot53.control()","5",&local_1684,&local_1688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1680);
  if (!bVar1) {
    testing::Message::Message(&local_1690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_1690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_1690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1680);
  local_16ac = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar_39.message_);
  local_16b0 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_16a8,"cnot53.target()","3",&local_16ac,&local_16b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16a8);
  if (!bVar1) {
    testing::Message::Message(&local_16b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_16a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_16b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_16b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16a8);
  local_16d4 = qclab::qgates::QControlledGate2<double>::controlState
                         ((QControlledGate2<double> *)&gtest_ar_39.message_);
  local_16d8 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_16d0,"cnot53.controlState()","1",&local_16d4,&local_16d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16d0);
  if (!bVar1) {
    testing::Message::Message(&local_16e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_16d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check_4.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check_4.data_,&local_16e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check_4.data_);
    testing::Message::~Message(&local_16e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16d0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__28.message_,1.0,0.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,
             1.0,0.0,0.0,1.0,0.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix(&local_1720);
  local_1709 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&local_1720,
                          (SquareMatrix<double> *)&gtest_ar__28.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1708,&local_1709,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&local_1720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1708);
  if (!bVar1) {
    testing::Message::Message(&local_1728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1750,(internal *)local_1708,(AssertionResult *)"cnot53.matrix() == CNOT_check"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1730,&local_1728);
    testing::internal::AssertHelper::~AssertHelper(&local_1730);
    std::__cxx11::string::~string((string *)&local_1750);
    testing::Message::~Message(&local_1728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1708);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_43.message_);
  local_18ec = qclab::qgates::CX<double>::toQASM((CX<double> *)&gtest_ar_39.message_,local_18c8,0);
  local_18f0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_18e8,"cnot53.toQASM( qasm )","0",&local_18ec,&local_18f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18e8);
  if (!bVar1) {
    testing::Message::Message(&local_18f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_18f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_18f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18e8);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[16],_nullptr>
            ((EqHelper *)local_1910,"qasm.str()","\"cx q[5], q[3];\\n\"",&local_1930,
             (char (*) [16])"cx q[5], q[3];\n");
  std::__cxx11::string::~string((string *)&local_1930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1910);
  if (!bVar1) {
    testing::Message::Message(&local_1938);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot01_1.gate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot01_1.gate_,&local_1938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot01_1.gate_);
    testing::Message::~Message(&local_1938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1910);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_43.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__28.message_);
  qclab::qgates::CX<double>::~CX((CX<double> *)&gtest_ar_39.message_);
  qclab::qgates::CX<double>::CX((CX<double> *)&gtest_ar_45.message_,0,1,0);
  local_196c = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar_45.message_);
  local_1970 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1968,"cnot01.nbQubits()","2",&local_196c,&local_1970);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1968);
  if (!bVar1) {
    testing::Message::Message(&local_1978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1968);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__29.message_,&local_1978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_1978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1968);
  local_1991 = qclab::qgates::CX<double>::fixed((CX<double> *)&gtest_ar_45.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1990,&local_1991,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1990);
  if (!bVar1) {
    testing::Message::Message(&local_19a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_1990,
               (AssertionResult *)"cnot01.fixed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_19a8,&local_19a0);
    testing::internal::AssertHelper::~AssertHelper(&local_19a8);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_19a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1990);
  local_19d9 = qclab::qgates::QControlledGate2<double>::controlled
                         ((QControlledGate2<double> *)&gtest_ar_45.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_19d8,&local_19d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19d8);
  if (!bVar1) {
    testing::Message::Message(&local_19e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_46.message_,(internal *)local_19d8,
               (AssertionResult *)"cnot01.controlled()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_19f0,&local_19e8);
    testing::internal::AssertHelper::~AssertHelper(&local_19f0);
    std::__cxx11::string::~string((string *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_19e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19d8);
  local_1a24 = qclab::qgates::QControlledGate2<double>::control
                         ((QControlledGate2<double> *)&gtest_ar_45.message_);
  local_1a28 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1a20,"cnot01.control()","0",&local_1a24,&local_1a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a20);
  if (!bVar1) {
    testing::Message::Message(&local_1a30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,199,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_1a30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_1a30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a20);
  local_1a4c = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar_45.message_);
  local_1a50 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1a48,"cnot01.target()","1",&local_1a4c,&local_1a50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a48);
  if (!bVar1) {
    testing::Message::Message(&local_1a58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_1a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_1a58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a48);
  local_1a74 = qclab::qgates::QControlledGate2<double>::controlState
                         ((QControlledGate2<double> *)&gtest_ar_45.message_);
  local_1a78 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1a70,"cnot01.controlState()","0",&local_1a74,&local_1a78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a70);
  if (!bVar1) {
    testing::Message::Message(&local_1a80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check_5.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check_5.data_,&local_1a80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check_5.data_);
    testing::Message::~Message(&local_1a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a70);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__31.message_,0.0,1.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,
             1.0,0.0,0.0,0.0,0.0,1.0);
  qclab::qgates::QControlledGate2<double>::matrix(&local_1ac0);
  local_1aa9 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&local_1ac0,
                          (SquareMatrix<double> *)&gtest_ar__31.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1aa8,&local_1aa9,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&local_1ac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1aa8);
  if (!bVar1) {
    testing::Message::Message(&local_1ac8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1af0,(internal *)local_1aa8,(AssertionResult *)"cnot01.matrix() == CNOT_check"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ad0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1ad0,&local_1ac8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ad0);
    std::__cxx11::string::~string((string *)&local_1af0);
    testing::Message::~Message(&local_1ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1aa8);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_49.message_);
  local_1c8c = qclab::qgates::CX<double>::toQASM((CX<double> *)&gtest_ar_45.message_,local_1c68,0);
  local_1c90 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1c88,"cnot01.toQASM( qasm )","0",&local_1c8c,&local_1c90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c88);
  if (!bVar1) {
    testing::Message::Message(&local_1c98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,&local_1c98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_1c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c88);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[32],_nullptr>
            ((EqHelper *)local_1cb0,"qasm.str()","\"x q[0];\\ncx q[0], q[1];\\nx q[0];\\n\"",
             &local_1cd0,(char (*) [32])"x q[0];\ncx q[0], q[1];\nx q[0];\n");
  std::__cxx11::string::~string((string *)&local_1cd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1cb0);
  if (!bVar1) {
    testing::Message::Message(&local_1cd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot10_1.gate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot10_1.gate_,&local_1cd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot10_1.gate_);
    testing::Message::~Message(&local_1cd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1cb0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_49.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__31.message_);
  qclab::qgates::CX<double>::~CX((CX<double> *)&gtest_ar_45.message_);
  qclab::qgates::CX<double>::CX((CX<double> *)&gtest_ar_51.message_,1,0,0);
  local_1d0c = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar_51.message_);
  local_1d10 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1d08,"cnot10.nbQubits()","2",&local_1d0c,&local_1d10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d08);
  if (!bVar1) {
    testing::Message::Message(&local_1d18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xdb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__32.message_,&local_1d18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__32.message_);
    testing::Message::~Message(&local_1d18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d08);
  local_1d31 = qclab::qgates::CX<double>::fixed((CX<double> *)&gtest_ar_51.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d30,&local_1d31,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d30);
  if (!bVar1) {
    testing::Message::Message(&local_1d40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_1d30,
               (AssertionResult *)"cnot10.fixed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d48,&local_1d40);
    testing::internal::AssertHelper::~AssertHelper(&local_1d48);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_1d40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d30);
  local_1d79 = qclab::qgates::QControlledGate2<double>::controlled
                         ((QControlledGate2<double> *)&gtest_ar_51.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d78,&local_1d79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d78);
  if (!bVar1) {
    testing::Message::Message(&local_1d88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_52.message_,(internal *)local_1d78,
               (AssertionResult *)"cnot10.controlled()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xdd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d90,&local_1d88);
    testing::internal::AssertHelper::~AssertHelper(&local_1d90);
    std::__cxx11::string::~string((string *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_1d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d78);
  local_1dc4 = qclab::qgates::QControlledGate2<double>::control
                         ((QControlledGate2<double> *)&gtest_ar_51.message_);
  local_1dc8 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1dc0,"cnot10.control()","1",&local_1dc4,&local_1dc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1dc0);
  if (!bVar1) {
    testing::Message::Message(&local_1dd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1dc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_1dd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_1dd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1dc0);
  local_1dec = qclab::qgates::CX<double>::target((CX<double> *)&gtest_ar_51.message_);
  local_1df0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1de8,"cnot10.target()","0",&local_1dec,&local_1df0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1de8);
  if (!bVar1) {
    testing::Message::Message(&local_1df8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1de8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,&local_1df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(&local_1df8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1de8);
  local_1e14 = qclab::qgates::QControlledGate2<double>::controlState
                         ((QControlledGate2<double> *)&gtest_ar_51.message_);
  local_1e18 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1e10,"cnot10.controlState()","0",&local_1e14,&local_1e18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e10);
  if (!bVar1) {
    testing::Message::Message(&local_1e20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check_6.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xe0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check_6.data_,&local_1e20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check_6.data_);
    testing::Message::~Message(&local_1e20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e10);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__34.message_,0.0,0.0,1.0,0.0,0.0,1.0,0.0,0.0,1.0,0.0,
             0.0,0.0,0.0,0.0,0.0,1.0);
  qclab::qgates::QControlledGate2<double>::matrix(&local_1e60);
  local_1e49 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&local_1e60,
                          (SquareMatrix<double> *)&gtest_ar__34.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e48,&local_1e49,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&local_1e60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e48);
  if (!bVar1) {
    testing::Message::Message(&local_1e68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e90,(internal *)local_1e48,(AssertionResult *)"cnot10.matrix() == CNOT_check"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e70,&local_1e68);
    testing::internal::AssertHelper::~AssertHelper(&local_1e70);
    std::__cxx11::string::~string((string *)&local_1e90);
    testing::Message::~Message(&local_1e68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e48);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_55.message_);
  local_202c = qclab::qgates::CX<double>::toQASM((CX<double> *)&gtest_ar_51.message_,local_2008,0);
  local_2030 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2028,"cnot10.toQASM( qasm )","0",&local_202c,&local_2030);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2028);
  if (!bVar1) {
    testing::Message::Message(&local_2038);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2028);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,&local_2038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(&local_2038);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2028);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[32],_nullptr>
            ((EqHelper *)local_2050,"qasm.str()","\"x q[1];\\ncx q[1], q[0];\\nx q[1];\\n\"",
             &local_2070,(char (*) [32])"x q[1];\ncx q[1], q[0];\nx q[1];\n");
  std::__cxx11::string::~string((string *)&local_2070);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2050);
  if (!bVar1) {
    testing::Message::Message(&local_2078);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2050);
    testing::internal::AssertHelper::AssertHelper
              (&local_2080,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2080,&local_2078);
    testing::internal::AssertHelper::~AssertHelper(&local_2080);
    testing::Message::~Message(&local_2078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2050);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_55.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__34.message_);
  qclab::qgates::CX<double>::~CX((CX<double> *)&gtest_ar_51.message_);
  return;
}

Assistant:

void test_qclab_qgates_CNOT() {

  //
  // CNOTs |1> controlled
  //
  {
    qclab::qgates::CNOT< T >  cnot ;

    EXPECT_EQ( cnot.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot.controlled() ) ;      // controlled
    EXPECT_EQ( cnot.control() , 0 ) ;       // control
    EXPECT_EQ( cnot.target() , 1 ) ;        // target
    EXPECT_EQ( cnot.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot.matrix() == CNOT_check ) ;

    // qubit
    EXPECT_EQ( cnot.qubit() , 0 ) ;

    // qubits
    auto qubits = cnot.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 5 , 3 } ;
    cnot.setQubits( &qnew[0] ) ;
    EXPECT_EQ( cnot.qubits()[0] , 3 ) ;
    EXPECT_EQ( cnot.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    cnot.setQubits( &qnew[0] ) ;

    // print
    cnot.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // gate
    qclab::qgates::PauliX< T >  X ;
    EXPECT_TRUE( *cnot.gate() == X ) ;
    EXPECT_TRUE( cnot.gate()->matrix() == X.matrix() ) ;

    // operators == and !=
    EXPECT_TRUE(  cnot != X ) ;
    EXPECT_FALSE( cnot == X ) ;
    qclab::qgates::CNOT< T >  cnot2 ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    // setControl, setTarget, setControlState
    cnot.setControl( 3 ) ;
    EXPECT_EQ( cnot.control() , 3 ) ;
    cnot.setTarget( 5 ) ;
    EXPECT_EQ( cnot.target() , 5 ) ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    cnot.setControl( 4 ) ;
    EXPECT_EQ( cnot.control() , 4 ) ;
    cnot.setTarget( 1 ) ;
    EXPECT_EQ( cnot.target() , 1 ) ;
    EXPECT_TRUE(  cnot != cnot2 ) ;
    EXPECT_FALSE( cnot == cnot2 ) ;

    qubits[0] = 1 ;
    qubits[1] = 2 ;
    cnot.setQubits( &qubits[0] ) ;
    EXPECT_EQ( cnot.control() , 1 ) ;
    EXPECT_EQ( cnot.target() , 2 ) ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    cnot.setControl( 0 ) ;
    EXPECT_EQ( cnot.control() , 0 ) ;
    cnot.setTarget( 1 ) ;
    EXPECT_EQ( cnot.target() , 1 ) ;
    cnot.setControlState( 0 ) ;
    EXPECT_EQ( cnot.controlState() , 0 ) ;
    EXPECT_TRUE(  cnot != cnot2 ) ;
    EXPECT_FALSE( cnot == cnot2 ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot01( 0 , 1 ) ;

    EXPECT_EQ( cnot01.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot01.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot01.controlled() ) ;      // controlled
    EXPECT_EQ( cnot01.control() , 0 ) ;       // control
    EXPECT_EQ( cnot01.target() , 1 ) ;        // target
    EXPECT_EQ( cnot01.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot01.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot01.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[0], q[1];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot35( 3 , 5 ) ;

    EXPECT_EQ( cnot35.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot35.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot35.controlled() ) ;      // controlled
    EXPECT_EQ( cnot35.control() , 3 ) ;       // control
    EXPECT_EQ( cnot35.target() , 5 ) ;        // target
    EXPECT_EQ( cnot35.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot35.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot35.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[3], q[5];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot10( 1 , 0 ) ;

    EXPECT_EQ( cnot10.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot10.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot10.controlled() ) ;      // controlled
    EXPECT_EQ( cnot10.control() , 1 ) ;       // control
    EXPECT_EQ( cnot10.target() , 0 ) ;        // target
    EXPECT_EQ( cnot10.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ) ;
    EXPECT_TRUE( cnot10.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot10.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[1], q[0];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot53( 5 , 3 ) ;

    EXPECT_EQ( cnot53.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot53.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot53.controlled() ) ;      // controlled
    EXPECT_EQ( cnot53.control() , 5 ) ;       // control
    EXPECT_EQ( cnot53.target() , 3 ) ;        // target
    EXPECT_EQ( cnot53.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ) ;
    EXPECT_TRUE( cnot53.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot53.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[5], q[3];\n" ) ;
  }


  //
  // CNOTs |0> controlled
  //
  {
    qclab::qgates::CNOT< T >  cnot01( 0 , 1 , 0 ) ;

    EXPECT_EQ( cnot01.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot01.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot01.controlled() ) ;      // controlled
    EXPECT_EQ( cnot01.control() , 0 ) ;       // control
    EXPECT_EQ( cnot01.target() , 1 ) ;        // target
    EXPECT_EQ( cnot01.controlState() , 0 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 0 , 1 , 0 , 0 ,
                                                 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( cnot01.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot01.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[0];\ncx q[0], q[1];\nx q[0];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot10( 1 , 0 , 0 ) ;

    EXPECT_EQ( cnot10.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot10.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot10.controlled() ) ;      // controlled
    EXPECT_EQ( cnot10.control() , 1 ) ;       // control
    EXPECT_EQ( cnot10.target() , 0 ) ;        // target
    EXPECT_EQ( cnot10.controlState() , 0 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( cnot10.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot10.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[1];\ncx q[1], q[0];\nx q[1];\n" ) ;
  }

}